

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O2

void remove_driver(char *pci_addr)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  char buf [512];
  char path [4096];
  
  snprintf(path,0x1000,"/sys/bus/pci/devices/%s/driver/unbind",pci_addr);
  iVar1 = open(path,1);
  if (iVar1 == -1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): no driver loaded\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x11,
            "remove_driver");
    return;
  }
  sVar2 = strlen(pci_addr);
  sVar2 = write(iVar1,pci_addr,sVar2);
  sVar3 = strlen(pci_addr);
  if (sVar2 != sVar3) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): failed to unload driver for device %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x15,
            "remove_driver",pci_addr);
  }
  iVar1 = close(iVar1);
  if (iVar1 != -1) {
    return;
  }
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  __xpg_strerror_r(iVar1,buf,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x17,
          "remove_driver","close",buf);
  exit(iVar1);
}

Assistant:

void remove_driver(const char* pci_addr) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/driver/unbind", pci_addr);
	int fd = open(path, O_WRONLY);
	if (fd == -1) {
		debug("no driver loaded");
		return;
	}
	if (write(fd, pci_addr, strlen(pci_addr)) != (ssize_t) strlen(pci_addr)) {
		warn("failed to unload driver for device %s", pci_addr);
	}
	check_err(close(fd), "close");
}